

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::verifyLookupTextureData
          (SparseTexture2LookupTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  undefined1 *this_00;
  pointer *pppSVar1;
  pointer pcVar2;
  GLint GVar3;
  _Alloc_hider _Var4;
  pointer puVar5;
  GLenum GVar6;
  GLenum GVar7;
  int iVar8;
  deUint32 err;
  uint uVar9;
  ostream *poVar10;
  size_t sVar11;
  TestError *this_01;
  undefined4 in_register_0000000c;
  ulong uVar12;
  bool bVar13;
  SparseTexture2LookupTestCase *this_02;
  long lVar14;
  int iVar15;
  size_type __new_size;
  ulong uVar16;
  GLint depth;
  GLenum local_6c8;
  GLuint verifyTexture;
  GLint height;
  GLint width;
  GLenum local_6b8;
  GLint local_6b4;
  pointer local_6b0;
  undefined8 local_6a8;
  ulong local_6a0;
  int local_694;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  FunctionToken f;
  ShaderProgram program;
  ProgramSources sources;
  TokenStringsExt s;
  
  local_6a8 = CONCAT44(in_register_0000000c,format);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             field_0x88;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verify Lookup Texture Data [function: ",0x26);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,(funcToken->name)._M_dataplus._M_p,
                       (funcToken->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", level: ",9);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] - ",4);
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0xab0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_6c8 = target;
  local_6b4 = level;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  GVar3 = width;
  bVar13 = true;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      minDepth <= depth)) {
    if (local_6c8 == 0x8513) {
      depth = depth * 6;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = (size_type)(height * width * depth);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar5 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_6b0 = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,__new_size);
    f.name._M_dataplus._M_p = (pointer)&f.name.field_2;
    pcVar2 = (funcToken->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f,pcVar2,pcVar2 + (funcToken->name)._M_string_length);
    f.arguments._M_dataplus._M_p = (pointer)&f.arguments.field_2;
    pcVar2 = (funcToken->arguments)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f.arguments,pcVar2,pcVar2 + (funcToken->arguments)._M_string_length);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&f.allowedTargets._M_t,&(funcToken->allowedTargets)._M_t);
    local_6b8 = 0x8c1a;
    if (local_6c8 == 0x9100) {
      local_6b8 = 0xde1;
    }
    gl4cts::Texture::Generate(gl,&verifyTexture);
    gl4cts::Texture::Bind(gl,verifyTexture,local_6b8);
    gl4cts::Texture::Storage(gl,local_6b8,1,0x8229,width,height,depth);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0xadc);
    if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        samples < 1) {
      bVar13 = true;
    }
    else {
      local_694 = GVar3 / 2;
      bVar13 = true;
      local_6a0 = 0;
      do {
        memset(local_6b0,0,__new_size);
        GVar6 = local_6b8;
        gl4cts::Texture::Bind(gl,verifyTexture,local_6b8);
        gl4cts::Texture::SubImage(gl,GVar6,0,0,0,0,width,height,depth,0x1903,0x1401,local_6b0);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"Texture::SubImage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xae5);
        this_02 = (SparseTexture2LookupTestCase *)st2_compute_lookupVerify;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&shader,st2_compute_lookupVerify,(allocator<char> *)&s);
        pppSVar1 = &program.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        createLookupShaderTokens
                  (&s,this_02,local_6c8,(GLint)local_6a8,local_6b4,(GLint)local_6a0,&f);
        replaceToken("<FUNCTION>",f.name._M_dataplus._M_p,&shader);
        replaceToken("<ARGUMENTS>",f.arguments._M_dataplus._M_p,&shader);
        replaceToken("<OUTPUT_TYPE>",s.super_TokenStrings.outputType._M_dataplus._M_p,&shader);
        replaceToken("<INPUT_TYPE>",s.super_TokenStrings.inputType._M_dataplus._M_p,&shader);
        replaceToken("<SIZE_DEF>",s.sizeDef._M_dataplus._M_p,&shader);
        replaceToken("<LOD>",s.lod._M_dataplus._M_p,&shader);
        replaceToken("<LOD_DEF>",s.lodDef._M_dataplus._M_p,&shader);
        replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&shader);
        replaceToken("<ICOORD_TYPE>",s.iCoordType._M_dataplus._M_p,&shader);
        replaceToken("<COORD_DEF>",s.coordDef._M_dataplus._M_p,&shader);
        replaceToken("<POINT_TYPE>",s.super_TokenStrings.pointType._M_dataplus._M_p,&shader);
        replaceToken("<POINT_DEF>",s.super_TokenStrings.pointDef._M_dataplus._M_p,&shader);
        replaceToken("<RETURN_TYPE>",s.super_TokenStrings.returnType._M_dataplus._M_p,&shader);
        replaceToken("<RESULT_EXPECTED>",s.super_TokenStrings.resultExpected._M_dataplus._M_p,
                     &shader);
        replaceToken("<EPSILON>",s.super_TokenStrings.epsilon._M_dataplus._M_p,&shader);
        replaceToken("<SAMPLE_DEF>",s.super_TokenStrings.sampleDef._M_dataplus._M_p,&shader);
        replaceToken("<REFZ_DEF>",s.refZDef._M_dataplus._M_p,&shader);
        replaceToken("<POINT_COORD>",s.pointCoord._M_dataplus._M_p,&shader);
        replaceToken("<COMPONENT_DEF>",s.componentDef._M_dataplus._M_p,&shader);
        replaceToken("<CUBE_MAP_COORD_DEF>",s.cubeMapCoordDef._M_dataplus._M_p,&shader);
        replaceToken("<OFFSET_ARRAY_DEF>",s.offsetArrayDef._M_dataplus._M_p,&shader);
        replaceToken("<FORMAT_DEF>",s.formatDef._M_dataplus._M_p,&shader);
        replaceToken("<OFFSET_TYPE>",s.offsetType._M_dataplus._M_p,&shader);
        replaceToken("<NOFFSET_TYPE>",s.nOffsetType._M_dataplus._M_p,&shader);
        replaceToken("<OFFSET_DIM>",s.offsetDim._M_dataplus._M_p,&shader);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
        std::ostream::operator<<(&sources,width);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
        std::ios_base::~ios_base
                  ((ios_base *)
                   &sources.sources[4].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        replaceToken("<TEX_WIDTH>",
                     (GLchar *)
                     CONCAT44(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start),&shader);
        if ((pointer *)
            CONCAT44(program.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (uint)program.m_shaders[0].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start) != pppSVar1) {
          operator_delete((undefined1 *)
                          CONCAT44(program.m_shaders[0].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)program.m_shaders[0].
                                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                          (long)program.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
        std::ostream::operator<<(&sources,height);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
        std::ios_base::~ios_base
                  ((ios_base *)
                   &sources.sources[4].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        replaceToken("<TEX_HEIGHT>",
                     (GLchar *)
                     CONCAT44(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start),&shader);
        if ((pointer *)
            CONCAT44(program.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (uint)program.m_shaders[0].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start) != pppSVar1) {
          operator_delete((undefined1 *)
                          CONCAT44(program.m_shaders[0].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)program.m_shaders[0].
                                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                          (long)program.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
        std::ostream::operator<<(&sources,depth);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
        std::ios_base::~ios_base
                  ((ios_base *)
                   &sources.sources[4].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        replaceToken("<TEX_DEPTH>",
                     (GLchar *)
                     CONCAT44(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start),&shader);
        if ((pointer *)
            CONCAT44(program.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (uint)program.m_shaders[0].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start) != pppSVar1) {
          operator_delete((undefined1 *)
                          CONCAT44(program.m_shaders[0].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)program.m_shaders[0].
                                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                          (long)program.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        memset(&sources,0,0xac);
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        sources._193_8_ = 0;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
        pppSVar1 = &program.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(program.m_shaders + 1);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pppSVar1,shader._M_dataplus._M_p,
                   shader._M_dataplus._M_p + shader._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(sources.sources +
                    (uint)program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start,(value_type *)pppSVar1);
        if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
            program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != program.m_shaders + 1) {
          operator_delete(program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                          (long)program.m_shaders[1].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
        }
        glu::ShaderProgram::ShaderProgram
                  (&program,((this->super_SparseTexture2CommitmentTestCase).
                             super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                            m_renderCtx,&sources);
        if (program.m_program.m_info.linkOk == true) {
          (*gl->useProgram)(program.m_program.m_program);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"glUseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb13);
          (*gl->bindImageTexture)(1,verifyTexture,0,'\x01',0,0x88b9,0x8232);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb1c);
          (*gl->uniform1i)(1,1);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb1e);
          iVar8 = std::__cxx11::string::compare((char *)&f);
          if (iVar8 == 0) {
            (*gl->bindImageTexture)(0,*texture,local_6b4,'\0',0,35000,(GLenum)local_6a8);
            GVar7 = (*gl->getError)();
            glu::checkError(GVar7,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb32);
            (*gl->uniform1i)(2,0);
            err = (*gl->getError)();
            iVar8 = 0xb34;
          }
          else {
            (*gl->activeTexture)(0x84c0);
            GVar7 = (*gl->getError)();
            glu::checkError(GVar7,"glActiveTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb24);
            (*gl->bindTexture)(local_6c8,*texture);
            GVar7 = (*gl->getError)();
            glu::checkError(GVar7,"glBindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb26);
            (*gl->uniform1i)(2,0);
            err = (*gl->getError)();
            iVar8 = 0xb28;
          }
          glu::checkError(err,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,iVar8);
          (*gl->uniform1i)(3,local_694);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb39);
          (*gl->dispatchCompute)(width,height,depth);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb3b);
          (*gl->memoryBarrier)(0xffffffff);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"glMemoryBarrier",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb3d);
          gl4cts::Texture::Bind(gl,verifyTexture,GVar6);
          gl4cts::Texture::GetData(gl,0,GVar6,0x1903,0x1401,local_6b0);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"Texture::GetData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb41);
          if (0 < (long)depth) {
            iVar8 = 0;
            lVar14 = 0;
            do {
              if (0 < height) {
                iVar15 = 0;
                uVar16 = 0;
                do {
                  if (0 < width) {
                    uVar12 = 0;
                    do {
                      bVar13 = (bool)(bVar13 & puVar5[uVar12 + (long)iVar15 + (long)iVar8] ==
                                               local_6b0[uVar12 + (long)iVar15 + (long)iVar8]);
                      uVar12 = uVar12 + 1;
                    } while ((uint)width != uVar12);
                  }
                  uVar16 = uVar16 + 1;
                  iVar15 = iVar15 + width;
                } while (uVar16 != (uint)height);
              }
              lVar14 = lVar14 + 1;
              iVar8 = iVar8 + width * height;
            } while (lVar14 != depth);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Compute shader compilation failed (lookup) for target: ",
                     0x37);
          poVar10 = (ostream *)std::ostream::operator<<(this_00,local_6c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", format: ",10);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_6a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", shaderInfoLog: ",0x11);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*program.m_shaders[5].
                                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                       infoLog._M_dataplus._M_p,
                               ((*program.m_shaders[5].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                               _M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", programInfoLog: ",0x12);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,program.m_program.m_info.infoLog._M_dataplus._M_p,
                               program.m_program.m_info.infoLog._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", shaderSource: ",0x10);
          _Var4 = shader._M_dataplus;
          if (shader._M_dataplus._M_p == (pointer)0x0) {
            std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
          }
          else {
            sVar11 = strlen(shader._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,_Var4._M_p,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," - ",3);
          bVar13 = false;
        }
        glu::ShaderProgram::~ShaderProgram(&program);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&sources.transformFeedbackVaryings);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(&sources.attribLocationBindings);
        lVar14 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar14));
          lVar14 = lVar14 + -0x18;
        } while (lVar14 != -0x18);
        TokenStringsExt::~TokenStringsExt(&s);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader._M_dataplus._M_p != &shader.field_2) {
          operator_delete(shader._M_dataplus._M_p,shader.field_2._M_allocated_capacity + 1);
        }
        uVar9 = (int)local_6a0 + 1;
        local_6a0 = (ulong)uVar9;
      } while ((int)uVar9 <
               (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               mState.samples);
    }
    gl4cts::Texture::Delete(gl,&verifyTexture);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&f.allowedTargets._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.arguments._M_dataplus._M_p != &f.arguments.field_2) {
      operator_delete(f.arguments._M_dataplus._M_p,f.arguments.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.name._M_dataplus._M_p != &f.name.field_2) {
      operator_delete(f.name._M_dataplus._M_p,f.name.field_2._M_allocated_capacity + 1);
    }
    if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar13;
}

Assistant:

bool SparseTexture2LookupTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
														   GLuint& texture, GLint level, FunctionToken& funcToken)
{
	mLog << "Verify Lookup Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height * depth;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint verifyTarget;
	if (target == GL_TEXTURE_2D_MULTISAMPLE)
		verifyTarget = GL_TEXTURE_2D;
	else
		verifyTarget = GL_TEXTURE_2D_ARRAY;

	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	for (int sample = 0; sample < mState.samples; ++sample)
	{
		deMemset(out_data, 0, texSize);

		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
						  (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

		std::string shader = st2_compute_lookupVerify;

		// Adjust shader source to texture format
		TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

		replaceToken("<FUNCTION>", f.name.c_str(), shader);
		replaceToken("<ARGUMENTS>", f.arguments.c_str(), shader);

		replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
		replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
		replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), shader);
		replaceToken("<LOD>", s.lod.c_str(), shader);
		replaceToken("<LOD_DEF>", s.lodDef.c_str(), shader);
		replaceToken("<COORD_TYPE>", s.coordType.c_str(), shader);
		replaceToken("<ICOORD_TYPE>", s.iCoordType.c_str(), shader);
		replaceToken("<COORD_DEF>", s.coordDef.c_str(), shader);
		replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
		replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
		replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
		replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
		replaceToken("<EPSILON>", s.epsilon.c_str(), shader);
		replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
		replaceToken("<REFZ_DEF>", s.refZDef.c_str(), shader);
		replaceToken("<POINT_COORD>", s.pointCoord.c_str(), shader);
		replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), shader);
		replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), shader);
		replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), shader);
		replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), shader);
		replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), shader);
		replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), shader);
		replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), shader);

		replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), shader);
		replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), shader);
		replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), shader);

		ProgramSources sources;
		sources << ComputeSource(shader);

		// Build and run shader
		ShaderProgram program(m_context.getRenderContext(), sources);
		if (program.isOk())
		{
			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

			// Pass output image to shader
			gl.bindImageTexture(1, //unit
								verifyTexture,
								0,		 //level
								GL_TRUE, //layered
								0,		 //layer
								GL_WRITE_ONLY, GL_R8UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.uniform1i(1, 1 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

			// Pass input sampler/image to shader
			if (f.name != "sparseImageLoadARB")
			{
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");
				gl.uniform1i(2, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			}
			else
			{
				gl.bindImageTexture(0, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(2, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			}

			// Pass committed region width to shader
			gl.uniform1i(3, widthCommitted /* committed region width */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.dispatchCompute(width, height, depth);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
			gl.memoryBarrier(GL_ALL_BARRIER_BITS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint z = 0; z < depth; ++z)
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width + z * width * height;
						GLubyte* outDataRegion = out_data + x + y * width + z * width * height;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
		}
		else
		{
			mLog << "Compute shader compilation failed (lookup) for target: " << target << ", format: " << format
				 << ", shaderInfoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
				 << ", programInfoLog: " << program.getProgramInfo().infoLog << ", shaderSource: " << shader.c_str()
				 << " - ";

			result = false;
		}
	}

	Texture::Delete(gl, verifyTexture);

	return result;
}